

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::HandlePDFBridgeSelection(BoardView *this)

{
  bool bVar1;
  ulong uVar2;
  BoardView *in_RDI;
  string selection;
  BoardView *in_stack_00000070;
  PDFBridgeEvince *in_stack_ffffffffffffffb8;
  string local_28 [32];
  
  bVar1 = PDFBridgeEvince::HasNewSelection((PDFBridgeEvince *)in_RDI);
  if (bVar1) {
    PDFBridgeEvince::GetSelection_abi_cxx11_(in_stack_ffffffffffffffb8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::c_str();
      SearchCompound(in_RDI,(char *)in_stack_ffffffffffffffb8);
      CenterZoomSearchResults(in_stack_00000070);
    }
    else {
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x12b43f);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )0x12b450);
    }
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

void BoardView::HandlePDFBridgeSelection() {
	if (pdfBridge.HasNewSelection()) {
		auto selection = pdfBridge.GetSelection();
		if (selection.empty()) {
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
		} else {
			SearchCompound(selection.c_str());
			CenterZoomSearchResults();
		}
	};
}